

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int mem_read(jas_stream_obj_t *obj,char *buf,uint cnt)

{
  int iVar1;
  ulong local_38;
  jas_stream_memobj_t *m;
  ssize_t n;
  uint cnt_local;
  char *buf_local;
  jas_stream_obj_t *obj_local;
  
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x495,"int mem_read(jas_stream_obj_t *, char *, unsigned int)");
  }
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("mem_read(%p, %p, %u)\n",obj,buf,(ulong)cnt);
  }
  local_38 = *(long *)((long)obj + 0x10) - *(long *)((long)obj + 0x18);
  if ((long)(ulong)cnt <= (long)local_38) {
    local_38 = (ulong)cnt;
  }
  memcpy(buf,(void *)(*obj + *(long *)((long)obj + 0x18)),local_38 & 0xffffffff);
  *(ulong *)((long)obj + 0x18) = (local_38 & 0xffffffff) + *(long *)((long)obj + 0x18);
  return (int)local_38;
}

Assistant:

static int mem_read(jas_stream_obj_t *obj, char *buf, unsigned cnt)
{
	ssize_t n;
	jas_stream_memobj_t *m;
	assert(buf);

	JAS_DBGLOG(100, ("mem_read(%p, %p, %u)\n", obj, buf, cnt));
	m = (jas_stream_memobj_t *)obj;
	n = m->len_ - m->pos_;
	cnt = JAS_MIN(n, cnt);
	memcpy(buf, &m->buf_[m->pos_], cnt);
	m->pos_ += cnt;
	return cnt;
}